

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTexture.cpp
# Opt level: O0

int __thiscall vkt::image::Texture::layerDimension(Texture *this)

{
  ImageType IVar1;
  Texture *this_local;
  
  IVar1 = this->m_type;
  if (IVar1 < IMAGE_TYPE_2D) {
LAB_00d527e7:
    this_local._4_4_ = 1;
  }
  else {
    if (1 < IVar1 - IMAGE_TYPE_2D) {
      if (IVar1 == IMAGE_TYPE_3D) {
        return 3;
      }
      if (1 < IVar1 - IMAGE_TYPE_CUBE) {
        if (IVar1 != IMAGE_TYPE_BUFFER) {
          return 0;
        }
        goto LAB_00d527e7;
      }
    }
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

int Texture::layerDimension (void) const
{
	switch (m_type)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
		case IMAGE_TYPE_1D_ARRAY:
			return 1;

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return 2;

		case IMAGE_TYPE_3D:
			return 3;

		default:
			DE_FATAL("Internal error");
			return 0;
	}
}